

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  undefined4 uVar2;
  uint uVar3;
  size_t sVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  size_t sVar6;
  RTCIntersectFunctionN p_Var7;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar8;
  size_t sVar9;
  long lVar10;
  NodeRef *pNVar11;
  size_t i_1;
  size_t sVar12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_2;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vint4 ai;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vint4 ai_1;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 ai_3;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 bi;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi_3;
  undefined1 auVar37 [16];
  vint4 bi_2;
  undefined1 auVar38 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 local_1808 [16];
  vint4 bi_8;
  RTCIntersectFunctionNArguments local_17d0;
  Geometry *local_17a0;
  undefined8 local_1798;
  RTCIntersectArguments *local_1790;
  undefined1 local_1788 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1778;
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined1 local_1728 [16];
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar23 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar14 = vpcmpeqd_avx(auVar23,(undefined1  [16])valid_i->field_0);
    auVar15 = ZEXT816(0) << 0x40;
    auVar41 = ZEXT1664(auVar15);
    auVar23 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar15,5);
    auVar29 = auVar14 & auVar23;
    if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0')
    {
      local_1788 = vandps_avx(auVar23,auVar14);
      local_1748 = *(undefined1 (*) [16])ray;
      auVar42 = ZEXT1664(local_1748);
      local_1758 = *(undefined1 (*) [16])(ray + 0x10);
      auVar43 = ZEXT1664(local_1758);
      local_1768 = *(undefined1 (*) [16])(ray + 0x20);
      auVar44 = ZEXT1664(local_1768);
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar27);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      auVar23 = vcmpps_avx(auVar23,auVar33,1);
      auVar14 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar33,auVar23);
      auVar23 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar27);
      auVar23 = vcmpps_avx(auVar23,auVar33,1);
      auVar29 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar33,auVar23);
      auVar23 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar27);
      auVar23 = vcmpps_avx(auVar23,auVar33,1);
      auVar23 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar33,auVar23);
      auVar27 = vrcpps_avx(auVar14);
      local_1708 = auVar27._0_4_;
      auVar25._0_4_ = auVar14._0_4_ * local_1708;
      fStack_1704 = auVar27._4_4_;
      auVar25._4_4_ = auVar14._4_4_ * fStack_1704;
      fStack_1700 = auVar27._8_4_;
      auVar25._8_4_ = auVar14._8_4_ * fStack_1700;
      fStack_16fc = auVar27._12_4_;
      auVar25._12_4_ = auVar14._12_4_ * fStack_16fc;
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar27 = vsubps_avx(auVar35,auVar25);
      auVar14 = vrcpps_avx(auVar29);
      local_16f8 = auVar14._0_4_;
      auVar31._0_4_ = auVar29._0_4_ * local_16f8;
      fStack_16f4 = auVar14._4_4_;
      auVar31._4_4_ = auVar29._4_4_ * fStack_16f4;
      fStack_16f0 = auVar14._8_4_;
      auVar31._8_4_ = auVar29._8_4_ * fStack_16f0;
      fStack_16ec = auVar14._12_4_;
      auVar31._12_4_ = auVar29._12_4_ * fStack_16ec;
      auVar29 = vsubps_avx(auVar35,auVar31);
      auVar14 = vrcpps_avx(auVar23);
      local_1718 = auVar14._0_4_;
      auVar28._0_4_ = local_1718 * auVar23._0_4_;
      fStack_1714 = auVar14._4_4_;
      auVar28._4_4_ = fStack_1714 * auVar23._4_4_;
      fStack_1710 = auVar14._8_4_;
      auVar28._8_4_ = fStack_1710 * auVar23._8_4_;
      fStack_170c = auVar14._12_4_;
      auVar28._12_4_ = fStack_170c * auVar23._12_4_;
      auVar14 = vsubps_avx(auVar35,auVar28);
      auVar23 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar15);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_1778.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar23,local_1788);
      auVar40 = ZEXT1664((undefined1  [16])local_1778);
      auVar23 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
      auVar39 = ZEXT1664(auVar23);
      local_1808._0_8_ = local_1788._0_8_ ^ 0xffffffffffffffff;
      local_1808._8_4_ = local_1788._8_4_ ^ 0xffffffff;
      local_1808._12_4_ = local_1788._12_4_ ^ 0xffffffff;
      local_16f8 = local_16f8 + local_16f8 * auVar29._0_4_;
      fStack_16f4 = fStack_16f4 + fStack_16f4 * auVar29._4_4_;
      fStack_16f0 = fStack_16f0 + fStack_16f0 * auVar29._8_4_;
      fStack_16ec = fStack_16ec + fStack_16ec * auVar29._12_4_;
      auVar23 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar15);
      auVar29._8_4_ = 0xff800000;
      auVar29._0_8_ = 0xff800000ff800000;
      auVar29._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar29,auVar23,local_1788);
      auVar38 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      local_1708 = local_1708 + local_1708 * auVar27._0_4_;
      fStack_1704 = fStack_1704 + fStack_1704 * auVar27._4_4_;
      fStack_1700 = fStack_1700 + fStack_1700 * auVar27._8_4_;
      fStack_16fc = fStack_16fc + fStack_16fc * auVar27._12_4_;
      local_1718 = local_1718 + local_1718 * auVar14._0_4_;
      fStack_1714 = fStack_1714 + fStack_1714 * auVar14._4_4_;
      fStack_1710 = fStack_1710 + fStack_1710 * auVar14._8_4_;
      fStack_170c = fStack_170c + fStack_170c * auVar14._12_4_;
      pNVar11 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar8 = &stack_near[2].field_0;
      stack_near[1].field_0 = local_1778;
      local_1738 = mm_lookupmask_ps._0_8_;
      uStack_1730 = mm_lookupmask_ps._8_8_;
LAB_00ecee43:
      pNVar1 = pNVar11 + -1;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        pNVar11 = pNVar11 + -1;
        aVar13 = paVar8[-1];
        paVar8 = paVar8 + -1;
        auVar23 = vcmpps_avx((undefined1  [16])aVar13,(undefined1  [16])bi_8.field_0,1);
        sVar12 = pNVar1->ptr;
        if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar23[0xf] < '\0') {
          do {
            if ((sVar12 & 8) != 0) {
              if (sVar12 == 0xfffffffffffffff8) goto LAB_00ecf15f;
              auVar23 = vcmpps_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])aVar13,6);
              if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar23[0xf] < '\0') {
                auVar23 = auVar39._0_16_ ^ local_1808;
                lVar10 = 0;
                aVar22 = bi_8.field_0;
                goto LAB_00ecefe5;
              }
              break;
            }
            sVar9 = 8;
            aVar13 = auVar38._0_16_;
            for (lVar10 = 0;
                (lVar10 != 4 &&
                (sVar4 = *(size_t *)((sVar12 & 0xfffffffffffffff0) + lVar10 * 8), sVar4 != 8));
                lVar10 = lVar10 + 1) {
              uVar2 = *(undefined4 *)(sVar12 + 0x20 + lVar10 * 4);
              auVar16._4_4_ = uVar2;
              auVar16._0_4_ = uVar2;
              auVar16._8_4_ = uVar2;
              auVar16._12_4_ = uVar2;
              auVar23 = vsubps_avx(auVar16,auVar42._0_16_);
              auVar26._0_4_ = local_1708 * auVar23._0_4_;
              auVar26._4_4_ = fStack_1704 * auVar23._4_4_;
              auVar26._8_4_ = fStack_1700 * auVar23._8_4_;
              auVar26._12_4_ = fStack_16fc * auVar23._12_4_;
              uVar2 = *(undefined4 *)(sVar12 + 0x40 + lVar10 * 4);
              auVar17._4_4_ = uVar2;
              auVar17._0_4_ = uVar2;
              auVar17._8_4_ = uVar2;
              auVar17._12_4_ = uVar2;
              auVar23 = vsubps_avx(auVar17,auVar43._0_16_);
              auVar30._0_4_ = local_16f8 * auVar23._0_4_;
              auVar30._4_4_ = fStack_16f4 * auVar23._4_4_;
              auVar30._8_4_ = fStack_16f0 * auVar23._8_4_;
              auVar30._12_4_ = fStack_16ec * auVar23._12_4_;
              uVar2 = *(undefined4 *)(sVar12 + 0x60 + lVar10 * 4);
              auVar18._4_4_ = uVar2;
              auVar18._0_4_ = uVar2;
              auVar18._8_4_ = uVar2;
              auVar18._12_4_ = uVar2;
              auVar23 = vsubps_avx(auVar18,auVar44._0_16_);
              auVar32._0_4_ = local_1718 * auVar23._0_4_;
              auVar32._4_4_ = fStack_1714 * auVar23._4_4_;
              auVar32._8_4_ = fStack_1710 * auVar23._8_4_;
              auVar32._12_4_ = fStack_170c * auVar23._12_4_;
              uVar2 = *(undefined4 *)(sVar12 + 0x30 + lVar10 * 4);
              auVar19._4_4_ = uVar2;
              auVar19._0_4_ = uVar2;
              auVar19._8_4_ = uVar2;
              auVar19._12_4_ = uVar2;
              auVar23 = vsubps_avx(auVar19,auVar42._0_16_);
              auVar34._0_4_ = local_1708 * auVar23._0_4_;
              auVar34._4_4_ = fStack_1704 * auVar23._4_4_;
              auVar34._8_4_ = fStack_1700 * auVar23._8_4_;
              auVar34._12_4_ = fStack_16fc * auVar23._12_4_;
              uVar2 = *(undefined4 *)(sVar12 + 0x50 + lVar10 * 4);
              auVar20._4_4_ = uVar2;
              auVar20._0_4_ = uVar2;
              auVar20._8_4_ = uVar2;
              auVar20._12_4_ = uVar2;
              auVar23 = vsubps_avx(auVar20,auVar43._0_16_);
              auVar36._0_4_ = local_16f8 * auVar23._0_4_;
              auVar36._4_4_ = fStack_16f4 * auVar23._4_4_;
              auVar36._8_4_ = fStack_16f0 * auVar23._8_4_;
              auVar36._12_4_ = fStack_16ec * auVar23._12_4_;
              uVar2 = *(undefined4 *)(sVar12 + 0x70 + lVar10 * 4);
              auVar21._4_4_ = uVar2;
              auVar21._0_4_ = uVar2;
              auVar21._8_4_ = uVar2;
              auVar21._12_4_ = uVar2;
              auVar23 = vsubps_avx(auVar21,auVar44._0_16_);
              auVar37._0_4_ = local_1718 * auVar23._0_4_;
              auVar37._4_4_ = fStack_1714 * auVar23._4_4_;
              auVar37._8_4_ = fStack_1710 * auVar23._8_4_;
              auVar37._12_4_ = fStack_170c * auVar23._12_4_;
              auVar23 = vpminsd_avx(auVar26,auVar34);
              auVar14 = vpminsd_avx(auVar30,auVar36);
              auVar23 = vpmaxsd_avx(auVar23,auVar14);
              auVar14 = vpminsd_avx(auVar32,auVar37);
              auVar14 = vpmaxsd_avx(auVar23,auVar14);
              auVar23 = vpmaxsd_avx(auVar26,auVar34);
              auVar29 = vpmaxsd_avx(auVar30,auVar36);
              auVar15 = vpminsd_avx(auVar23,auVar29);
              auVar23 = vpmaxsd_avx(auVar32,auVar37);
              auVar29 = vpmaxsd_avx(auVar14,auVar40._0_16_);
              auVar23 = vpminsd_avx(auVar23,(undefined1  [16])bi_8.field_0);
              auVar23 = vpminsd_avx(auVar15,auVar23);
              auVar23 = vcmpps_avx(auVar29,auVar23,2);
              sVar6 = sVar9;
              aVar5 = aVar13;
              if (((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar23[0xf] < '\0') &&
                 (aVar5.v = (__m128)vblendvps_avx(auVar38._0_16_,auVar14,auVar23), sVar6 = sVar4,
                 sVar9 != 8)) {
                pNVar11->ptr = sVar9;
                pNVar11 = pNVar11 + 1;
                *paVar8 = aVar13;
                paVar8 = paVar8 + 1;
              }
              aVar13 = aVar5;
              sVar9 = sVar6;
            }
            sVar12 = sVar9;
          } while (sVar9 != 8);
        }
        goto LAB_00ecee43;
      }
LAB_00ecf15f:
      auVar23 = vandps_avx(local_1808,local_1788);
      auVar24._8_4_ = 0xff800000;
      auVar24._0_8_ = 0xff800000ff800000;
      auVar24._12_4_ = 0xff800000;
      auVar23 = vmaskmovps_avx(auVar23,auVar24);
      *(undefined1 (*) [16])(ray + 0x80) = auVar23;
    }
  }
  return;
  while( true ) {
    local_17d0.geomID = *(uint *)((sVar12 & 0xfffffffffffffff0) + lVar10 * 8);
    local_17a0 = (context->scene->geometries).items[local_17d0.geomID].ptr;
    uVar3 = local_17a0->mask;
    auVar14._4_4_ = uVar3;
    auVar14._0_4_ = uVar3;
    auVar14._8_4_ = uVar3;
    auVar14._12_4_ = uVar3;
    auVar14 = vandps_avx(auVar14,*(undefined1 (*) [16])(ray + 0x90));
    auVar14 = vpcmpeqd_avx(auVar41._0_16_,auVar14);
    auVar29 = auVar23 & ~auVar14;
    aVar22.v[1] = uStack_1730;
    aVar22.v[0] = local_1738;
    local_1728 = auVar23;
    if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0')
    {
      mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vandnps_avx(auVar14,auVar23);
      local_17d0.primID = *(uint *)((sVar12 & 0xfffffffffffffff0) + 4 + lVar10 * 8);
      local_17d0.valid = (int *)&mask;
      local_17d0.geometryUserPtr = local_17a0->userPtr;
      local_17d0.context = context->user;
      local_17d0.N = 4;
      local_1798 = 0;
      local_1790 = context->args;
      p_Var7 = local_1790->intersect;
      if (p_Var7 == (RTCIntersectFunctionN)0x0) {
        p_Var7 = (RTCIntersectFunctionN)
                 local_17a0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      local_17d0.rayhit = (RTCRayHitN *)ray;
      (*p_Var7)(&local_17d0);
      auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
      aVar22 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
               vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,1);
      auVar42 = ZEXT1664(local_1748);
      auVar43 = ZEXT1664(local_1758);
      auVar44 = ZEXT1664(local_1768);
      auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar40 = ZEXT1664((undefined1  [16])local_1778);
    }
    auVar14 = auVar39._0_16_;
    auVar23 = vandnps_avx((undefined1  [16])aVar22,local_1728);
    lVar10 = lVar10 + 1;
    local_1728 = local_1728 & ~(undefined1  [16])aVar22;
    if ((((local_1728 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (local_1728 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (local_1728 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        -1 < local_1728[0xf]) break;
LAB_00ecefe5:
    auVar14 = auVar39._0_16_;
    if ((ulong)((uint)sVar12 & 0xf) - 8 == lVar10) break;
  }
  auVar29 = vpcmpeqd_avx((undefined1  [16])aVar22,(undefined1  [16])aVar22);
  auVar15._0_4_ = auVar23._0_4_ ^ auVar29._0_4_;
  auVar15._4_4_ = auVar23._4_4_ ^ auVar29._4_4_;
  auVar15._8_4_ = auVar23._8_4_ ^ auVar29._8_4_;
  auVar15._12_4_ = auVar23._12_4_ ^ auVar29._12_4_;
  local_1808 = vorps_avx(local_1808,auVar15);
  auVar23 = vpcmpeqd_avx(auVar15,auVar15);
  auVar23 = auVar23 & ~local_1808;
  if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar23[0xf])
  goto LAB_00ecf15f;
  auVar23 = vpcmpeqd_avx(auVar14,auVar14);
  auVar39 = ZEXT1664(auVar23);
  auVar23._8_4_ = 0xff800000;
  auVar23._0_8_ = 0xff800000ff800000;
  auVar23._12_4_ = 0xff800000;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx((undefined1  [16])bi_8.field_0,auVar23,local_1808);
  goto LAB_00ecee43;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }